

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::TypedExpectation<void_(int_*,_unsigned_long)>::Matches
          (TypedExpectation<void_(int_*,_unsigned_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<int_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  *in_RDI;
  tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void> *in_stack_00000008;
  MutexBase *in_stack_00000010;
  tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void>
  *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  MutexBase::AssertHeld(in_stack_00000010);
  bVar1 = TupleMatches<std::tr1::tuple<testing::Matcher<int*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<int*,unsigned_long,void,void,void,void,void,void,void,void>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tr1::tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
               ::Matches((MatcherBase<const_std::tr1::tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                          *)in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }